

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

void __thiscall
icu_63::PluralAvailableLocalesEnumeration::PluralAvailableLocalesEnumeration
          (PluralAvailableLocalesEnumeration *this,UErrorCode *status)

{
  UBool UVar1;
  UResourceBundle *pUVar2;
  LocalPointerBase<UResourceBundle> local_30;
  LocalUResourceBundlePointer rb;
  UErrorCode *status_local;
  PluralAvailableLocalesEnumeration *this_local;
  
  StringEnumeration::StringEnumeration(&this->super_StringEnumeration);
  (this->super_StringEnumeration).super_UObject._vptr_UObject =
       (_func_int **)&PTR__PluralAvailableLocalesEnumeration_004a0c28;
  this->fLocales = (UResourceBundle *)0x0;
  this->fRes = (UResourceBundle *)0x0;
  *(UErrorCode *)&(this->super_StringEnumeration).field_0x74 = *status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    *(undefined4 *)&(this->super_StringEnumeration).field_0x74 = 0;
    pUVar2 = ures_openDirect_63((char *)0x0,"plurals",
                                (UErrorCode *)&(this->super_StringEnumeration).field_0x74);
    LocalUResourceBundlePointer::LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_30,pUVar2);
    pUVar2 = LocalPointerBase<UResourceBundle>::getAlias(&local_30);
    pUVar2 = ures_getByKey_63(pUVar2,"locales",(UResourceBundle *)0x0,
                              (UErrorCode *)&(this->super_StringEnumeration).field_0x74);
    this->fLocales = pUVar2;
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_30);
  }
  return;
}

Assistant:

PluralAvailableLocalesEnumeration::PluralAvailableLocalesEnumeration(UErrorCode &status) {
    fOpenStatus = status;
    if (U_FAILURE(status)) {
        return;
    }
    fOpenStatus = U_ZERO_ERROR; // clear any warnings.
    LocalUResourceBundlePointer rb(ures_openDirect(nullptr, "plurals", &fOpenStatus));
    fLocales = ures_getByKey(rb.getAlias(), "locales", nullptr, &fOpenStatus);
}